

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

uint32_t hex32_to_digest(char *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  bVar1 = hex8_to_digest(data);
  bVar2 = hex8_to_digest(data + 2);
  bVar3 = hex8_to_digest(data + 4);
  bVar4 = hex8_to_digest(data + 6);
  return (uint)bVar4 | ((uint)bVar3 << 0x10) >> 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18;
}

Assistant:

uint32_t hex32_to_digest(const char data[8])
{
	union {
		uint32_t	value;
		uint8_t		parts[4];
	} result;

	result.parts[0] = hex8_to_digest(&data[0]);
	result.parts[1] = hex8_to_digest(&data[2]);
	result.parts[2] = hex8_to_digest(&data[4]);
	result.parts[3] = hex8_to_digest(&data[6]);

	return ntohl(result.value);
}